

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [2],
          uint *params_2,char (*params_3) [10],StringPtr *params_4,char (*params_5) [2])

{
  String *value;
  char (*pacVar1) [2];
  uint *value_00;
  char (*value_01) [10];
  StringPtr *value_02;
  String *params_5_00;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  CappedArray<char,_14UL> local_70;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  StringPtr *local_38;
  StringPtr *params_local_4;
  char (*params_local_3) [10];
  uint *params_local_2;
  char (*params_local_1) [2];
  String *params_local;
  
  params_5_00 = __return_storage_ptr__;
  local_38 = (StringPtr *)params_3;
  params_local_4 = (StringPtr *)params_2;
  params_local_3 = (char (*) [10])params_1;
  params_local_2 = (uint *)params;
  params_local_1 = (char (*) [2])this;
  params_local = __return_storage_ptr__;
  value = fwd<kj::String&>((String *)this);
  local_48 = toCharSequence<kj::String&>(value);
  pacVar1 = ::const((char (*) [2])params_local_2);
  local_58 = toCharSequence<char_const(&)[2]>(pacVar1);
  value_00 = fwd<unsigned_int>((NoInfer<unsigned_int> *)params_local_3);
  toCharSequence<unsigned_int>(&local_70,value_00);
  value_01 = ::const((char (*) [10])params_local_4);
  local_80 = toCharSequence<char_const(&)[10]>(value_01);
  value_02 = fwd<kj::StringPtr&>(local_38);
  local_90 = toCharSequence<kj::StringPtr&>(value_02);
  pacVar1 = ::const((char (*) [2])params_4);
  local_a0 = toCharSequence<char_const(&)[2]>(pacVar1);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_5_00,(_ *)&local_48,&local_58,(ArrayPtr<const_char> *)&local_70,
             (CappedArray<char,_14UL> *)&local_80,&local_90,&local_a0,
             (ArrayPtr<const_char> *)params_5_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}